

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_257,_true,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined1 auVar8 [12];
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  float fVar52;
  vfloat4 a0;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    auVar43 = ZEXT464((uint)fVar1);
    auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar1) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar22 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar8 = ZEXT812(0) << 0x20;
      auVar25 = ZEXT816(0) << 0x40;
      auVar53._4_12_ = auVar8;
      auVar53._0_4_ = auVar22._0_4_;
      auVar20 = vrsqrt14ss_avx512f(auVar25,auVar53);
      fVar52 = auVar20._0_4_;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      local_1218[0] = fVar52 * 1.5 - auVar22._0_4_ * 0.5 * fVar52 * fVar52 * fVar52;
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar52 = (ray->dir).field_0.m128[2];
      auVar54._0_4_ = aVar5.x * local_1218[0];
      auVar54._4_4_ = aVar5.y * local_1218[0];
      auVar54._8_4_ = aVar5.z * local_1218[0];
      auVar54._12_4_ = aVar5.field_3.w * local_1218[0];
      auVar20 = vshufpd_avx(auVar54,auVar54,1);
      auVar22 = vmovshdup_avx(auVar54);
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      auVar59._0_4_ = auVar22._0_4_ ^ 0x80000000;
      auVar22 = vunpckhps_avx(auVar54,auVar25);
      auVar59._4_12_ = auVar8;
      auVar24 = vshufps_avx(auVar22,auVar59,0x41);
      auVar57._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      auVar57._8_8_ = auVar61._8_8_ ^ auVar20._8_8_;
      auVar21 = vinsertps_avx(auVar57,auVar54,0x2a);
      auVar22 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar20 = vdpps_avx(auVar21,auVar21,0x7f);
      uVar7 = vcmpps_avx512vl(auVar20,auVar22,1);
      auVar22 = vpmovm2d_avx512vl(uVar7);
      auVar62._0_4_ = auVar22._0_4_;
      auVar62._4_4_ = auVar62._0_4_;
      auVar62._8_4_ = auVar62._0_4_;
      auVar62._12_4_ = auVar62._0_4_;
      uVar19 = vpmovd2m_avx512vl(auVar62);
      auVar22 = vpcmpeqd_avx(auVar62,auVar62);
      auVar20._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar22._4_4_;
      auVar20._0_4_ = (uint)((byte)uVar19 & 1) * auVar22._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar22._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar22._12_4_;
      auVar22 = vblendvps_avx(auVar21,auVar24,auVar20);
      auVar20 = vdpps_avx(auVar22,auVar22,0x7f);
      auVar63._4_12_ = auVar8;
      auVar63._0_4_ = auVar20._0_4_;
      auVar21 = vrsqrt14ss_avx512f(auVar25,auVar63);
      fVar60 = auVar21._0_4_;
      fVar60 = fVar60 * 1.5 - auVar20._0_4_ * 0.5 * fVar60 * fVar60 * fVar60;
      auVar58._0_4_ = fVar60 * auVar22._0_4_;
      auVar58._4_4_ = fVar60 * auVar22._4_4_;
      auVar58._8_4_ = fVar60 * auVar22._8_4_;
      auVar58._12_4_ = fVar60 * auVar22._12_4_;
      auVar22 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar20 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar64._0_4_ = auVar20._0_4_ * auVar58._0_4_;
      auVar64._4_4_ = auVar20._4_4_ * auVar58._4_4_;
      auVar64._8_4_ = auVar20._8_4_ * auVar58._8_4_;
      auVar64._12_4_ = auVar20._12_4_ * auVar58._12_4_;
      auVar22 = vfmsub231ps_fma(auVar64,auVar54,auVar22);
      auVar20 = vshufps_avx(auVar22,auVar22,0xc9);
      auVar22 = vdpps_avx(auVar20,auVar20,0x7f);
      auVar65._4_12_ = auVar8;
      auVar65._0_4_ = auVar22._0_4_;
      auVar21 = vrsqrt14ss_avx512f(auVar25,auVar65);
      fVar60 = auVar21._0_4_;
      fVar60 = fVar60 * 1.5 - auVar22._0_4_ * 0.5 * fVar60 * fVar60 * fVar60;
      auVar56._0_4_ = auVar20._0_4_ * fVar60;
      auVar56._4_4_ = auVar20._4_4_ * fVar60;
      auVar56._8_4_ = auVar20._8_4_ * fVar60;
      auVar56._12_4_ = auVar20._12_4_ * fVar60;
      auVar49._0_4_ = local_1218[0] * auVar54._0_4_;
      auVar49._4_4_ = local_1218[0] * auVar54._4_4_;
      auVar49._8_4_ = local_1218[0] * auVar54._8_4_;
      auVar49._12_4_ = local_1218[0] * auVar54._12_4_;
      auVar21 = vunpcklps_avx(auVar58,auVar49);
      auVar22 = vunpckhps_avx(auVar58,auVar49);
      auVar24 = vunpcklps_avx(auVar56,auVar25);
      auVar20 = vunpckhps_avx(auVar56,auVar25);
      local_11e8 = vunpcklps_avx(auVar22,auVar20);
      local_1208 = vunpcklps_avx(auVar21,auVar24);
      local_11f8 = vunpckhps_avx(auVar21,auVar24);
      puVar15 = local_11d0;
      auVar20 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar5,auVar22);
      auVar21._8_4_ = 0x219392ef;
      auVar21._0_8_ = 0x219392ef219392ef;
      auVar21._12_4_ = 0x219392ef;
      uVar19 = vcmpps_avx512vl(auVar22,auVar21,1);
      auVar50._8_4_ = 0x3f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      auVar50._12_4_ = 0x3f800000;
      auVar22 = vdivps_avx(auVar50,(undefined1  [16])aVar5);
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar18 = (bool)((byte)uVar19 & 1);
      auVar23._0_4_ = (uint)bVar18 * auVar21._0_4_ | (uint)!bVar18 * auVar22._0_4_;
      bVar18 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar18 * auVar21._4_4_ | (uint)!bVar18 * auVar22._4_4_;
      bVar18 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar18 * auVar21._8_4_ | (uint)!bVar18 * auVar22._8_4_;
      bVar18 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar18 * auVar21._12_4_ | (uint)!bVar18 * auVar22._12_4_;
      auVar24._8_4_ = 0x3f7ffffa;
      auVar24._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar24._12_4_ = 0x3f7ffffa;
      auVar24 = vmulps_avx512vl(auVar23,auVar24);
      auVar25._8_4_ = 0x3f800003;
      auVar25._0_8_ = 0x3f8000033f800003;
      auVar25._12_4_ = 0x3f800003;
      auVar25 = vmulps_avx512vl(auVar23,auVar25);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar69._4_4_ = uVar4;
      auVar69._0_4_ = uVar4;
      auVar69._8_4_ = uVar4;
      auVar69._12_4_ = uVar4;
      auVar69._16_4_ = uVar4;
      auVar69._20_4_ = uVar4;
      auVar69._24_4_ = uVar4;
      auVar69._28_4_ = uVar4;
      auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar28 = vbroadcastss_avx512vl(auVar24);
      auVar22 = vmovshdup_avx(auVar24);
      auVar29 = vbroadcastsd_avx512vl(auVar22);
      auVar33._8_4_ = 2;
      auVar33._0_8_ = 0x200000002;
      auVar33._12_4_ = 2;
      auVar33._16_4_ = 2;
      auVar33._20_4_ = 2;
      auVar33._24_4_ = 2;
      auVar33._28_4_ = 2;
      auVar21 = vshufpd_avx(auVar24,auVar24,1);
      auVar30 = vpermps_avx512vl(auVar33,ZEXT1632(auVar24));
      auVar31 = vbroadcastss_avx512vl(auVar25);
      auVar32._8_4_ = 1;
      auVar32._0_8_ = 0x100000001;
      auVar32._12_4_ = 1;
      auVar32._16_4_ = 1;
      auVar32._20_4_ = 1;
      auVar32._24_4_ = 1;
      auVar32._28_4_ = 1;
      auVar32 = vpermps_avx512vl(auVar32,ZEXT1632(auVar25));
      auVar33 = vpermps_avx512vl(auVar33,ZEXT1632(auVar25));
      uVar17 = (ulong)(auVar24._0_4_ < 0.0) * 0x20;
      uVar19 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x80;
      auVar34 = vbroadcastss_avx512vl(auVar20);
      auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
LAB_0068f034:
      if (puVar15 != &local_11d8) {
        uVar11 = puVar15[-1];
        puVar15 = puVar15 + -1;
LAB_0068f045:
        if ((uVar11 & 0xf) == 0) {
          auVar36 = vsubps_avx(*(undefined1 (*) [32])(uVar11 + 0x40 + uVar17),auVar69);
          auVar36 = vmulps_avx512vl(auVar28,auVar36);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar11 + 0x40 + uVar19),auVar26);
          auVar37 = vmulps_avx512vl(auVar29,auVar37);
          auVar36 = vmaxps_avx(auVar36,auVar37);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar11 + 0x40 + uVar16),auVar27);
          auVar38 = vmulps_avx512vl(auVar30,auVar37);
          auVar37 = vsubps_avx(*(undefined1 (*) [32])(uVar11 + 0x40 + (uVar17 ^ 0x20)),auVar69);
          auVar37 = vmulps_avx512vl(auVar31,auVar37);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar11 + 0x40 + (uVar19 ^ 0x20)),auVar26)
          ;
          auVar39 = vmulps_avx512vl(auVar32,auVar39);
          auVar37 = vminps_avx(auVar37,auVar39);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar11 + 0x40 + (uVar16 ^ 0x20)),auVar27)
          ;
          auVar39 = vmulps_avx512vl(auVar33,auVar39);
          auVar38 = vmaxps_avx512vl(auVar38,auVar34);
          auVar36 = vmaxps_avx(auVar36,auVar38);
          auVar38 = vminps_avx512vl(auVar39,auVar35);
          auVar37 = vminps_avx(auVar37,auVar38);
          uVar7 = vcmpps_avx512vl(auVar36,auVar37,2);
          uVar13 = (uint)uVar7;
        }
        else {
          if ((int)(uVar11 & 0xf) != 2) {
            cVar9 = (**(code **)((long)This->leafIntersector +
                                (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40 + 8))
                              (local_1218,ray,context);
            auVar45._8_56_ = extraout_var_00;
            auVar45._0_8_ = extraout_XMM1_Qa;
            auVar43._8_56_ = extraout_var;
            auVar43._0_8_ = extraout_XMM0_Qa;
            if (cVar9 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_0068f034;
          }
          uVar14 = uVar11 & 0xfffffffffffffff0;
          auVar36 = *(undefined1 (*) [32])(uVar14 + 0x100);
          auVar44._0_4_ = fVar52 * auVar36._0_4_;
          auVar44._4_4_ = fVar52 * auVar36._4_4_;
          auVar44._8_4_ = fVar52 * auVar36._8_4_;
          auVar44._12_4_ = fVar52 * auVar36._12_4_;
          auVar44._16_4_ = fVar52 * auVar36._16_4_;
          auVar44._20_4_ = fVar52 * auVar36._20_4_;
          auVar44._28_36_ = auVar43._28_36_;
          auVar44._24_4_ = fVar52 * auVar36._24_4_;
          auVar37 = *(undefined1 (*) [32])(uVar14 + 0x120);
          auVar46._0_4_ = fVar52 * auVar37._0_4_;
          auVar46._4_4_ = fVar52 * auVar37._4_4_;
          auVar46._8_4_ = fVar52 * auVar37._8_4_;
          auVar46._12_4_ = fVar52 * auVar37._12_4_;
          auVar46._16_4_ = fVar52 * auVar37._16_4_;
          auVar46._20_4_ = fVar52 * auVar37._20_4_;
          auVar46._28_36_ = auVar45._28_36_;
          auVar46._24_4_ = fVar52 * auVar37._24_4_;
          auVar38 = *(undefined1 (*) [32])(uVar14 + 0x140);
          auVar39._4_4_ = fVar52 * auVar38._4_4_;
          auVar39._0_4_ = fVar52 * auVar38._0_4_;
          auVar39._8_4_ = fVar52 * auVar38._8_4_;
          auVar39._12_4_ = fVar52 * auVar38._12_4_;
          auVar39._16_4_ = fVar52 * auVar38._16_4_;
          auVar39._20_4_ = fVar52 * auVar38._20_4_;
          auVar39._24_4_ = fVar52 * auVar38._24_4_;
          auVar39._28_4_ = fVar52;
          auVar6._4_4_ = uVar3;
          auVar6._0_4_ = uVar3;
          auVar6._8_4_ = uVar3;
          auVar6._12_4_ = uVar3;
          auVar6._16_4_ = uVar3;
          auVar6._20_4_ = uVar3;
          auVar6._24_4_ = uVar3;
          auVar6._28_4_ = uVar3;
          auVar22 = vfmadd231ps_fma(auVar44._0_32_,auVar6,*(undefined1 (*) [32])(uVar14 + 0xa0));
          auVar20 = vfmadd231ps_fma(auVar46._0_32_,auVar6,*(undefined1 (*) [32])(uVar14 + 0xc0));
          auVar21 = vfmadd231ps_fma(auVar39,auVar6,*(undefined1 (*) [32])(uVar14 + 0xe0));
          auVar47._4_4_ = uVar2;
          auVar47._0_4_ = uVar2;
          auVar47._8_4_ = uVar2;
          auVar47._12_4_ = uVar2;
          auVar47._16_4_ = uVar2;
          auVar47._20_4_ = uVar2;
          auVar47._24_4_ = uVar2;
          auVar47._28_4_ = uVar2;
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar47,*(undefined1 (*) [32])(uVar14 + 0x40))
          ;
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar47,*(undefined1 (*) [32])(uVar14 + 0x60))
          ;
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar47,*(undefined1 (*) [32])(uVar14 + 0x80))
          ;
          auVar66._8_4_ = 0x7fffffff;
          auVar66._0_8_ = 0x7fffffff7fffffff;
          auVar66._12_4_ = 0x7fffffff;
          auVar66._16_4_ = 0x7fffffff;
          auVar66._20_4_ = 0x7fffffff;
          auVar66._24_4_ = 0x7fffffff;
          auVar66._28_4_ = 0x7fffffff;
          auVar39 = vandps_avx(auVar66,ZEXT1632(auVar22));
          auVar68._8_4_ = 0x219392ef;
          auVar68._0_8_ = 0x219392ef219392ef;
          auVar68._12_4_ = 0x219392ef;
          auVar68._16_4_ = 0x219392ef;
          auVar68._20_4_ = 0x219392ef;
          auVar68._24_4_ = 0x219392ef;
          auVar68._28_4_ = 0x219392ef;
          uVar10 = vcmpps_avx512vl(auVar39,auVar68,1);
          bVar18 = (bool)((byte)uVar10 & 1);
          auVar40._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar22._0_4_;
          bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar22._4_4_;
          bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar22._8_4_;
          bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar22._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * 0x219392ef;
          auVar40._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * 0x219392ef;
          auVar40._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * 0x219392ef;
          auVar40._28_4_ = (uint)(byte)(uVar10 >> 7) * 0x219392ef;
          auVar39 = vandps_avx(auVar66,ZEXT1632(auVar20));
          uVar10 = vcmpps_avx512vl(auVar39,auVar68,1);
          bVar18 = (bool)((byte)uVar10 & 1);
          auVar41._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar20._0_4_;
          bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar20._4_4_;
          bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar20._8_4_;
          bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar20._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * 0x219392ef;
          auVar41._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * 0x219392ef;
          auVar41._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * 0x219392ef;
          auVar41._28_4_ = (uint)(byte)(uVar10 >> 7) * 0x219392ef;
          auVar39 = vandps_avx(auVar66,ZEXT1632(auVar21));
          uVar10 = vcmpps_avx512vl(auVar39,auVar68,1);
          bVar18 = (bool)((byte)uVar10 & 1);
          auVar42._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar21._0_4_;
          bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar21._4_4_;
          bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar21._8_4_;
          bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar21._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * 0x219392ef;
          auVar42._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * 0x219392ef;
          auVar42._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * 0x219392ef;
          auVar42._28_4_ = (uint)(byte)(uVar10 >> 7) * 0x219392ef;
          auVar39 = vrcp14ps_avx512vl(auVar40);
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          auVar67._16_4_ = 0x3f800000;
          auVar67._20_4_ = 0x3f800000;
          auVar67._24_4_ = 0x3f800000;
          auVar67._28_4_ = 0x3f800000;
          auVar22 = vfnmadd213ps_fma(auVar40,auVar39,auVar67);
          auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar39,auVar39);
          auVar39 = vrcp14ps_avx512vl(auVar41);
          auVar20 = vfnmadd213ps_fma(auVar41,auVar39,auVar67);
          auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar39,auVar39);
          auVar39 = vrcp14ps_avx512vl(auVar42);
          auVar21 = vfnmadd213ps_fma(auVar42,auVar39,auVar67);
          auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar39,auVar39);
          auVar36 = vfmadd213ps_avx512vl(auVar36,auVar27,*(undefined1 (*) [32])(uVar14 + 0x160));
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar27,*(undefined1 (*) [32])(uVar14 + 0x180));
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar27,*(undefined1 (*) [32])(uVar14 + 0x1a0));
          auVar36 = vfmadd231ps_avx512vl(auVar36,auVar26,*(undefined1 (*) [32])(uVar14 + 0xa0));
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar26,*(undefined1 (*) [32])(uVar14 + 0xc0));
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar26,*(undefined1 (*) [32])(uVar14 + 0xe0));
          auVar24 = vfmadd231ps_fma(auVar36,auVar69,*(undefined1 (*) [32])(uVar14 + 0x40));
          auVar55._0_4_ = -auVar22._0_4_ * auVar24._0_4_;
          auVar55._4_4_ = -auVar22._4_4_ * auVar24._4_4_;
          auVar55._8_4_ = -auVar22._8_4_ * auVar24._8_4_;
          auVar55._12_4_ = -auVar22._12_4_ * auVar24._12_4_;
          auVar55._16_4_ = 0x80000000;
          auVar55._20_4_ = 0x80000000;
          auVar55._24_4_ = 0x80000000;
          auVar55._28_4_ = 0;
          auVar24 = vfmadd231ps_fma(auVar37,auVar69,*(undefined1 (*) [32])(uVar14 + 0x60));
          auVar51._0_4_ = -auVar20._0_4_ * auVar24._0_4_;
          auVar51._4_4_ = -auVar20._4_4_ * auVar24._4_4_;
          auVar51._8_4_ = -auVar20._8_4_ * auVar24._8_4_;
          auVar51._12_4_ = -auVar20._12_4_ * auVar24._12_4_;
          auVar51._16_4_ = 0x80000000;
          auVar51._20_4_ = 0x80000000;
          auVar51._24_4_ = 0x80000000;
          auVar51._28_4_ = 0;
          auVar24 = vfmadd231ps_fma(auVar38,auVar69,*(undefined1 (*) [32])(uVar14 + 0x80));
          auVar48._0_4_ = -auVar21._0_4_ * auVar24._0_4_;
          auVar48._4_4_ = -auVar21._4_4_ * auVar24._4_4_;
          auVar48._8_4_ = -auVar21._8_4_ * auVar24._8_4_;
          auVar48._12_4_ = -auVar21._12_4_ * auVar24._12_4_;
          auVar48._16_4_ = 0x80000000;
          auVar48._20_4_ = 0x80000000;
          auVar48._24_4_ = 0x80000000;
          auVar48._28_4_ = 0;
          auVar38 = ZEXT1632(CONCAT412(auVar22._12_4_ + auVar55._12_4_,
                                       CONCAT48(auVar22._8_4_ + auVar55._8_4_,
                                                CONCAT44(auVar22._4_4_ + auVar55._4_4_,
                                                         auVar22._0_4_ + auVar55._0_4_))));
          auVar39 = ZEXT1632(CONCAT412(auVar20._12_4_ + auVar51._12_4_,
                                       CONCAT48(auVar20._8_4_ + auVar51._8_4_,
                                                CONCAT44(auVar20._4_4_ + auVar51._4_4_,
                                                         auVar20._0_4_ + auVar51._0_4_))));
          auVar47 = ZEXT1632(CONCAT412(auVar21._12_4_ + auVar48._12_4_,
                                       CONCAT48(auVar21._8_4_ + auVar48._8_4_,
                                                CONCAT44(auVar21._4_4_ + auVar48._4_4_,
                                                         auVar21._0_4_ + auVar48._0_4_))));
          auVar6 = vpminsd_avx2(auVar55,auVar38);
          auVar36 = vpminsd_avx2(auVar51,auVar39);
          auVar37 = vpminsd_avx2(auVar48,auVar47);
          auVar36 = vmaxps_avx(auVar36,auVar37);
          auVar38 = vpmaxsd_avx2(auVar55,auVar38);
          auVar37 = vpmaxsd_avx2(auVar51,auVar39);
          auVar39 = vpmaxsd_avx2(auVar48,auVar47);
          auVar37 = vminps_avx(auVar37,auVar39);
          auVar39 = vmaxps_avx512vl(auVar34,auVar6);
          auVar36 = vmaxps_avx(auVar39,auVar36);
          auVar38 = vminps_avx512vl(auVar35,auVar38);
          auVar38 = vminps_avx(auVar38,auVar37);
          auVar37._8_4_ = 0x3f7ffffa;
          auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
          auVar37._12_4_ = 0x3f7ffffa;
          auVar37._16_4_ = 0x3f7ffffa;
          auVar37._20_4_ = 0x3f7ffffa;
          auVar37._24_4_ = 0x3f7ffffa;
          auVar37._28_4_ = 0x3f7ffffa;
          auVar37 = vmulps_avx512vl(auVar36,auVar37);
          auVar36._8_4_ = 0x3f800003;
          auVar36._0_8_ = 0x3f8000033f800003;
          auVar36._12_4_ = 0x3f800003;
          auVar36._16_4_ = 0x3f800003;
          auVar36._20_4_ = 0x3f800003;
          auVar36._24_4_ = 0x3f800003;
          auVar36._28_4_ = 0x3f800003;
          auVar36 = vmulps_avx512vl(auVar38,auVar36);
          uVar7 = vcmpps_avx512vl(auVar37,auVar36,2);
          uVar13 = (uint)uVar7;
        }
        auVar45 = ZEXT3264(auVar37);
        auVar43 = ZEXT3264(auVar36);
        if ((byte)uVar13 == 0) goto LAB_0068f034;
        uVar10 = uVar11 & 0xfffffffffffffff0;
        lVar12 = 0;
        for (uVar11 = (ulong)(byte)uVar13; (uVar11 & 1) == 0;
            uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
        uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
        uVar14 = (ulong)uVar13;
        if (uVar13 != 0) {
          *puVar15 = uVar11;
          lVar12 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar14 = (ulong)uVar13;
          bVar18 = uVar13 == 0;
          while( true ) {
            puVar15 = puVar15 + 1;
            uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
            if (bVar18) break;
            *puVar15 = uVar11;
            lVar12 = 0;
            for (uVar11 = uVar14; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            bVar18 = uVar14 == 0;
          }
        }
        goto LAB_0068f045;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }